

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::AggressiveDCEPass::IsTargetDead(AggressiveDCEPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t id;
  DefUseManager *pDVar2;
  Instruction *inst_00;
  bool dead;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  id = Instruction::GetSingleWordInOperand(inst,0);
  pDVar2 = Pass::get_def_use_mgr((Pass *)this);
  inst_00 = analysis::DefUseManager::GetDef(pDVar2,id);
  bVar1 = IsAnnotationInst(inst_00->opcode_);
  if (bVar1) {
    if (inst_00->opcode_ != OpDecorationGroup) {
      __assert_fail("tInst->opcode() == spv::Op::OpDecorationGroup",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                    ,0xb7,"bool spvtools::opt::AggressiveDCEPass::IsTargetDead(Instruction *)");
    }
    dead = true;
    pDVar2 = Pass::get_def_use_mgr((Pass *)this);
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:185:43)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:185:43)>
               ::_M_manager;
    local_40._M_unused._M_object = &dead;
    analysis::DefUseManager::ForEachUser
              (pDVar2,inst_00,(function<void_(spvtools::opt::Instruction_*)> *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
  }
  else {
    bVar1 = IsLive(this,inst_00);
    dead = !bVar1;
  }
  return dead;
}

Assistant:

bool AggressiveDCEPass::IsTargetDead(Instruction* inst) {
  const uint32_t tId = inst->GetSingleWordInOperand(0);
  Instruction* tInst = get_def_use_mgr()->GetDef(tId);
  if (IsAnnotationInst(tInst->opcode())) {
    // This must be a decoration group. We go through annotations in a specific
    // order. So if this is not used by any group or group member decorates, it
    // is dead.
    assert(tInst->opcode() == spv::Op::OpDecorationGroup);
    bool dead = true;
    get_def_use_mgr()->ForEachUser(tInst, [&dead](Instruction* user) {
      if (user->opcode() == spv::Op::OpGroupDecorate ||
          user->opcode() == spv::Op::OpGroupMemberDecorate)
        dead = false;
    });
    return dead;
  }
  return !IsLive(tInst);
}